

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 __thiscall glcts::BlendExclusion(glcts *this,Vec4 *src,Vec4 *dst)

{
  Vec4 VVar1;
  Vec4 rgb;
  Vec4 local_18;
  
  local_18.m_data[0] = src->m_data[0] * -2.0 * dst->m_data[0] + src->m_data[0] + dst->m_data[0];
  local_18.m_data[1] = src->m_data[1] * -2.0 * dst->m_data[1] + src->m_data[1] + dst->m_data[1];
  local_18.m_data[2] = src->m_data[2] * -2.0 * dst->m_data[2] + src->m_data[2] + dst->m_data[2];
  local_18.m_data[3] = 0.0;
  VVar1 = Blend(this,&local_18,src,dst);
  return (Vec4)VVar1.m_data;
}

Assistant:

static tcu::Vec4 BlendExclusion(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(Exclusion(src[0], dst[0]), Exclusion(src[1], dst[1]), Exclusion(src[2], dst[2]), 0.f);
	return Blend(rgb, src, dst);
}